

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O1

void __thiscall CTestGen9Resource_TestMSAA_Test::TestBody(CTestGen9Resource_TestMSAA_Test *this)

{
  _Tuple_impl<5UL,_int> _Var1;
  TEST_BPP Bpp;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  CTestGen9Resource_TestMSAA_Test *pCVar6;
  pointer ptVar7;
  CTestGen9Resource_TestMSAA_Test *pCVar8;
  ulong uVar9;
  ulong uVar10;
  GMM_RESOURCE_INFO *pGVar11;
  undefined1 auVar12 [8];
  TEST_MSAA MSAA;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong ExpectedValue;
  anon_union_8_3_ffc73876_for_GMM_RESCREATE_PARAMS_REC_6 aVar17;
  uint uVar18;
  uint32_t ExpectedValue_00;
  uint uVar19;
  undefined1 auStack_148 [8];
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  List;
  GMM_RESCREATE_PARAMS local_108;
  uint32_t local_84;
  uint local_80;
  uint32_t ExpectedMCSBpp;
  CTestGen9Resource_TestMSAA_Test *local_78;
  ulong local_70;
  double local_68;
  ulong local_60;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t MCSHAlign;
  uint32_t MCSVAlign;
  uint32_t VAlign;
  uint32_t TileDimY;
  uint32_t local_40;
  TEST_TILE_TYPE local_3c;
  uint32_t HAlign;
  byte local_31;
  uint32_t TileDimX;
  
  local_40 = 0;
  MCSHAlign = 0;
  HAlign = 0;
  MCSVAlign = 0;
  local_58 = 0;
  local_54 = 0;
  auStack_148 = (undefined1  [8])0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BuildInputIterator((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                      *)auStack_148,4,2,false);
  ptVar7 = List.
           super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar8 = this;
  auVar12 = auStack_148;
  pCVar6 = local_78;
  do {
    local_78 = pCVar8;
    if (auVar12 == (undefined1  [8])ptVar7) {
      if (auStack_148 != (undefined1  [8])0x0) {
        local_78 = pCVar6;
        operator_delete((void *)auStack_148);
      }
      return;
    }
    _Var1.super__Head_base<5UL,_int,_false>._M_head_impl =
         (((pointer)auVar12)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
         super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>.
         super__Tuple_impl<4UL,_int,_int>.super__Tuple_impl<5UL,_int>.
         super__Head_base<5UL,_int,_false>;
    List.
    super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(long)(((pointer)auVar12)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
                        super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
                        super__Tuple_impl<2UL,_int,_bool,_int,_int>.
                        super__Tuple_impl<3UL,_bool,_int,_int>.super__Tuple_impl<4UL,_int,_int>.
                        super__Head_base<4UL,_int,_false>._M_head_impl;
    local_31 = (((pointer)auVar12)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
               super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
               super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>.
               super__Head_base<3UL,_bool,_false>._M_head_impl;
    Bpp = (((pointer)auVar12)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
          super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Head_base<1UL,_int,_false>.
          _M_head_impl;
    local_3c = (((pointer)auVar12)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
               super__Head_base<0UL,_int,_false>._M_head_impl;
    ExpectedMCSBpp = 0xfffff000;
    if (local_3c == TEST_TILEYS) {
      ExpectedMCSBpp = 0xffff0000;
    }
    local_60 = 0x1000;
    if (local_3c == TEST_TILEYS) {
      local_60 = 0x10000;
    }
    local_108.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    local_108.MultiTileArch._0_1_ = 0;
    local_108.MultiTileArch.GpuVaMappingSet = '\0';
    local_108.MultiTileArch.LocalMemEligibilitySet = '\0';
    local_108.MultiTileArch.LocalMemPreferredSet = '\0';
    local_108.MultiTileArch.Reserved = 0;
    local_108.ExistingSysMemSize = 0;
    local_108.MaximumRenamingListLength = 0;
    local_108.NoGfxMemory = '\0';
    local_108._109_3_ = 0;
    local_108.RotateInfo = 0;
    local_108._84_4_ = 0;
    local_108.pExistingSysMem = 0;
    local_108.MaxLod = 0;
    local_108.ArraySize = 0;
    local_108.BaseAlignment = 0;
    local_108.OverridePitch = 0;
    local_108.field_6.BaseWidth64 = 0;
    local_108.BaseHeight = 0;
    local_108.Depth = 0;
    local_108.MSAA.NumSamples = 0;
    local_108.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    local_108.CpTag = 0;
    local_108._44_4_ = 0;
    local_108.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    local_108.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    local_108.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    local_108.Type = RESOURCE_INVALID;
    local_108.Format = GMM_FORMAT_INVALID;
    local_108.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    if ((int)local_3c < 4 &&
        (((pointer)auVar12)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
        super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_bool,_int,_int>
        .super__Head_base<2UL,_int,_false>._M_head_impl == 1) {
      if ((local_31 & 1) == 0) {
        if ((local_3c == TEST_TILEX) || (1 < Bpp - TEST_BPP_16)) goto LAB_0016fac6;
        CTestResource::SetTileFlag((CTestResource *)this,&local_108,local_3c);
        uVar9 = 0x40;
        if ((local_31 & 1) != 0) {
          uVar9 = 0x800000;
        }
      }
      else {
        CTestResource::SetTileFlag((CTestResource *)this,&local_108,local_3c);
        uVar9 = 0x800000;
      }
      local_108.Flags.Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)local_108.Flags.Gpu & 0xffffffffff7fffbf | uVar9);
      local_108.ArraySize =
           *(undefined4 *)
            (&DAT_001a88b0 + (long)(int)_Var1.super__Head_base<5UL,_int,_false>._M_head_impl * 4);
      local_108.NoGfxMemory = '\x01';
      local_108.Format = GMM_FORMAT_INVALID;
      if (Bpp < TEST_BPP_MAX) {
        local_108.Format = (&DAT_001ad00c)[Bpp];
      }
      local_108.Type = RESOURCE_2D;
      local_68 = (double)Bpp;
      local_60 = (ulong)((int)local_60 - 1);
      uVar10 = ~local_60;
      uVar9 = 1;
      local_80 = local_31 & 1;
      do {
        MSAA = (TEST_MSAA)uVar9;
        CTestResource::GetAlignmentAndTileDimensionsForMSAA
                  ((CTestResource *)this,Bpp,SUB41(local_80,0),local_3c,MSAA,&HAlign,&MCSVAlign,
                   &local_40,&MCSHAlign,&local_84,&local_58,&local_54);
        local_108.field_6.BaseWidth =
             HAlign * *(int *)(&DAT_001a8890 +
                              (long)List.
                                    super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 8) + 1;
        local_108.field_6.BaseWidth64._4_4_ = 0;
        local_108.Depth = 1;
        local_108.BaseHeight =
             MCSVAlign *
             *(int *)(&DAT_001a8894 +
                     (long)List.
                           super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage * 8) + 1;
        dVar2 = exp2((double)(int)MSAA);
        local_108.MSAA.NumSamples = (uint32_t)(long)dVar2;
        local_108.Flags.Gpu =
             (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_108.Flags.Gpu & 0xffffffffffff7fff);
        pGVar11 = (GMM_RESOURCE_INFO *)
                  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                            (CommonULT::pGmmULTClientContext,&local_108);
        _VAlign = pGVar11;
        if (pGVar11 == (GMM_RESOURCE_INFO *)0x0) goto LAB_0016faa4;
        CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar11,local_40);
        CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar11,MCSHAlign);
        local_70 = uVar9;
        if ((local_31 & 1) != 0) {
          uVar14 = (local_40 - 1) + local_108.field_6.BaseWidth;
          uVar18 = -local_40;
          dVar2 = exp2(local_68);
          iVar13 = (int)(long)dVar2 * (uVar18 & uVar14) + HAlign;
          uVar14 = (local_40 - 1) + local_108.field_6.BaseWidth;
          uVar18 = -local_40;
          dVar2 = exp2(local_68);
          ExpectedValue_00 =
               ~((int)(long)dVar2 * (uVar18 & uVar14) + -1 + HAlign & HAlign - 1) + iVar13;
          CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar11,ExpectedValue_00);
          if (local_3c != TEST_LINEAR) {
            CTestResource::VerifyResourcePitchInTiles<true>
                      ((CTestResource *)this,_VAlign,ExpectedValue_00 / HAlign);
          }
          uVar14 = -MCSHAlign & (local_108.BaseHeight - 1) + MCSHAlign;
          if (1 < local_108.ArraySize) {
            CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,_VAlign,(ulong)uVar14);
          }
          CTestResource::VerifyResourceSize<true>
                    ((CTestResource *)this,_VAlign,
                     (ulong)((-MCSVAlign &
                             (MCSVAlign - 1) +
                             uVar14 * local_108.MSAA.NumSamples * local_108.ArraySize) *
                             ExpectedValue_00 + (int)local_60 & ExpectedMCSBpp));
          goto LAB_0016f9c6;
        }
        switch(MSAA) {
        case MSAA_2x:
          lVar16 = 2;
          bVar5 = false;
          goto LAB_0016f880;
        case MSAA_4x:
          lVar16 = 2;
          goto LAB_0016f87c;
        case MSAA_8x:
          MSAA = MSAA_4x;
          lVar16 = 4;
          bVar4 = true;
          bVar5 = true;
          break;
        case MSAA_16x:
          lVar16 = 4;
LAB_0016f87c:
          bVar5 = true;
LAB_0016f880:
          bVar4 = true;
          break;
        default:
          MSAA = MSAA_2x;
          lVar16 = 1;
          bVar4 = false;
          bVar5 = false;
        }
        aVar17.BaseWidth64 = local_108.field_6.BaseWidth64 + 1 & 0xfffffffffffffffe;
        if (!bVar4) {
          aVar17 = local_108.field_6;
        }
        uVar14 = local_108.BaseHeight + 1 & 0xfffffffe;
        if (!bVar5) {
          uVar14 = local_108.BaseHeight;
        }
        local_108.BaseHeight = uVar14;
        uVar18 = local_40 - 1;
        local_108.field_6 = aVar17;
        dVar2 = exp2(local_68);
        uVar19 = HAlign - 1;
        iVar15 = (int)lVar16 * local_108.field_6.BaseWidth;
        iVar13 = local_40 - 1;
        uVar14 = -local_40;
        dVar3 = exp2(local_68);
        this = local_78;
        uVar9 = ((ulong)uVar19 +
                ((long)dVar2 & 0xffffffffU) *
                (~(ulong)uVar18 & aVar17.BaseWidth64 * lVar16 + (ulong)uVar18)) -
                (ulong)((int)(long)dVar3 * (uVar14 & iVar13 + iVar15) + -1 + HAlign & HAlign - 1);
        CTestResource::VerifyResourcePitch<true>((CTestResource *)local_78,_VAlign,(uint32_t)uVar9);
        if (local_3c != TEST_LINEAR) {
          CTestResource::VerifyResourcePitchInTiles<true>
                    ((CTestResource *)this,_VAlign,(uint32_t)((uVar9 & 0xffffffff) / (ulong)HAlign))
          ;
        }
        ExpectedValue = (ulong)(-MCSHAlign & (MCSHAlign - 1) + MSAA * local_108.BaseHeight);
        if (1 < local_108.ArraySize) {
          CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,_VAlign,ExpectedValue);
        }
        CTestResource::VerifyResourceSize<true>
                  ((CTestResource *)this,_VAlign,
                   (uVar9 & 0xffffffff) *
                   (~(ulong)(MCSVAlign - 1) &
                   ((ulong)local_108._64_8_ >> 0x20) * ExpectedValue + (ulong)(MCSVAlign - 1)) +
                   local_60 & uVar10);
LAB_0016f9c6:
        local_108.Flags.Gpu =
             (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_108.Flags.Gpu | 0x8000);
        pGVar11 = (GMM_RESOURCE_INFO *)
                  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                            (CommonULT::pGmmULTClientContext,&local_108);
        CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar11,local_58);
        CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar11,local_54);
        uVar14 = (-local_58 & (local_58 - 1) + local_108.field_6.BaseWidth) * local_84 + 0x7f;
        uVar18 = uVar14 & 0xffffff80;
        CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar11,uVar18);
        CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar11,uVar14 >> 7);
        uVar14 = -local_54 & (local_108.BaseHeight - 1) + local_54;
        if (1 < local_108.ArraySize) {
          CTestResource::VerifyResourceQPitch<true>((CTestResource *)local_78,pGVar11,(ulong)uVar14)
          ;
        }
        this = local_78;
        CTestResource::VerifyResourceSize<true>
                  ((CTestResource *)local_78,pGVar11,
                   (ulong)((uVar14 * local_108.ArraySize + 0x1f & 0xffffffe0) * uVar18));
        uVar9 = local_70;
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,pGVar11);
LAB_0016faa4:
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,_VAlign);
        uVar14 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar14;
      } while (uVar14 != 5);
    }
LAB_0016fac6:
    auVar12 = (undefined1  [8])((long)auVar12 + 0x18);
    pCVar8 = local_78;
    pCVar6 = local_78;
  } while( true );
}

Assistant:

TEST_F(CTestGen9Resource, TestMSAA)
{
    //Tile dimensions in Bytes
    const uint32_t MCSTileSize[1][2] = {128, 32}; //MCS is TileY

    //Gen9: MSAA 16x no MCS for width > 8K
    //No MSAA for YUV/compressed formats
    //Interleaved MSS (IMS) for Depth/Stencil. Arrayed MSS (CMS) for Color RT
    //MSS (Arrayed): px_wL, px_hL = pixel width/height of single sample at Lod L
    //  MSS width = px_wL, MSS height = NumSamples*px_hL
    //MSS (Interleaved): px_wL, px_hL = pixel width/height of single sample at Lod L
    // Samples         MSS width                MSS Height
    //   2x            4*ceil(px_wL/2)             px_hL
    //   4x            4*ceil(px_wL/2)           4*ceil(px_hL/2)
    //   8x            8*ceil(px_wL/2)           4*ceil(px_hL/2)
    //  16x            8*ceil(px_wL/2)           8*ceil(px_hL/2)
    //MCS (bpp): 2x/4x - bpp_8, 8x - bpp_32, 16x - bpp_64

    const uint32_t TestDimensions[4][2] = {
    //Input dimensions in #Tiles
    {15, 20}, //16 Tiles x 20 <Max Width: Depth MSS crosses Pitch limit beyond this>
    {0, 0},   //1x1x1
    {1, 0},   //2 Tilesx1
    {1, 1},   //2 Tiles x 2
    };

    uint32_t TestArraySize[2] = {1, 5};

    uint32_t HAlign = 0, VAlign = 0, TileDimX = 0, TileDimY = 0;
    uint32_t MCSHAlign = 0, MCSVAlign = 0, TileSize = 0;
    uint32_t ExpectedMCSBpp;
    std::vector<tuple<int, int, int, bool, int, int>> List; //TEST_TILE_TYPE, TEST_BPP, TEST_RESOURCE_TYPE, Depth or RT, TestDimension index, ArraySize
    auto Size = BuildInputIterator(List, 4, 2, false);             // Size of arrays TestDimensions, TestArraySize

    for(auto element : List)
    {
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Flags.Info           = {0};

        TEST_TILE_TYPE     Tiling     = (TEST_TILE_TYPE)std::get<0>(element);
        TEST_BPP           Bpp        = (TEST_BPP)std::get<1>(element);
        TEST_RESOURCE_TYPE ResType    = (TEST_RESOURCE_TYPE)std::get<2>(element);
        bool               IsRT       = std::get<3>(element); // True for RT, False for Depth
        int                TestDimIdx = std::get<4>(element); //index into TestDimensions array
        int                ArrayIdx   = std::get<5>(element); //index into TestArraySize
        TileSize                      = (Tiling == TEST_TILEYS) ? GMM_KBYTE(64) : GMM_KBYTE(4);

        //Discard un-supported Tiling/Res_type/bpp for this test
        if(ResType != TEST_RESOURCE_2D || Tiling >= TEST_TILEYF         //No 1D/3D/Cube. Supported 2D mip-maps/array
           || (!IsRT && (Tiling == TEST_TILEX ||
                         !(Bpp == TEST_BPP_16 || Bpp == TEST_BPP_32)))) //depth supported on 16bit, 32bit formats only
            continue;

        SetTileFlag(gmmParams, Tiling);
        SetResType(gmmParams, ResType);
        SetResGpuFlags(gmmParams, IsRT);
        SetResArraySize(gmmParams, TestArraySize[ArrayIdx]);

        gmmParams.NoGfxMemory = 1;
        gmmParams.Format      = SetResourceFormat(Bpp);
        for(uint32_t k = MSAA_2x; k <= MSAA_16x; k++)
        {
            GetAlignmentAndTileDimensionsForMSAA(Bpp, IsRT, Tiling, (TEST_MSAA)k,
                                                 TileDimX, TileDimY, HAlign, VAlign,
                                                 ExpectedMCSBpp, MCSHAlign, MCSVAlign);

            gmmParams.BaseWidth64     = TestDimensions[TestDimIdx][0] * TileDimX + 0x1;
            gmmParams.BaseHeight      = TestDimensions[TestDimIdx][1] * TileDimY + 0x1;
            gmmParams.Depth           = 0x1;
            gmmParams.MSAA.NumSamples = static_cast<uint32_t>(pow((double)2, k));
            gmmParams.Flags.Gpu.MCS   = 0;

            //MSS surface
            GMM_RESOURCE_INFO *MSSResourceInfo;
            MSSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            if(MSSResourceInfo)
            {
                VerifyResourceHAlign<true>(MSSResourceInfo, HAlign);
                VerifyResourceVAlign<true>(MSSResourceInfo, VAlign);
                if(IsRT) //Arrayed MSS
                {
                    uint32_t ExpectedPitch = 0, ExpectedQPitch = 0;
                    ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); // Aligned width * bpp, aligned to TileWidth
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);

                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
                    if(gmmParams.ArraySize > 1) //Gen9: Qpitch is distance between array slices (not sample slices)
                    {
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }

                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.MSAA.NumSamples * gmmParams.ArraySize, TileDimY); //Align Height =ExpectedPitch * NumSamples * ExpectedQPitch, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));
                }
                else // Interleaved MSS
                {
                    uint32_t WidthMultiplier, HeightMultiplier;
                    GetInterleaveMSSPattern((TEST_MSAA)k, WidthMultiplier, HeightMultiplier, IsRT, Bpp);
                    gmmParams.BaseWidth64 = WidthMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseWidth64, 2) : gmmParams.BaseWidth64;
                    gmmParams.BaseHeight  = HeightMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseHeight, 2) : gmmParams.BaseHeight;

                    uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64 * WidthMultiplier, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX);
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                    {
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);
                    }

                    uint64_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight * HeightMultiplier, VAlign);
                    if(gmmParams.ArraySize > 1)
                    {
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }
                    uint64_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, TileDimY);            //Align Height = ExpectedQPitch*ArraySize, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize)); //ExpectedPitch *ExpectedHeight
                }
            }

            //No MCS surface if MSS creation failed
            if(MSSResourceInfo)
            {
                gmmParams.Flags.Gpu.MCS = 1;
                GMM_RESOURCE_INFO *MCSResourceInfo;
                MCSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

                VerifyResourceHAlign<true>(MCSResourceInfo, MCSHAlign);
                VerifyResourceVAlign<true>(MCSResourceInfo, MCSVAlign);

                uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, MCSHAlign) * ExpectedMCSBpp, MCSTileSize[0][0]); // Align in texels, tehn multiply w/ Bpt
                VerifyResourcePitch<true>(MCSResourceInfo, ExpectedPitch);
                VerifyResourcePitchInTiles<true>(MCSResourceInfo, ExpectedPitch / MCSTileSize[0][0]);

                uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign);
                if(gmmParams.ArraySize > 1)
                {
                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign); //QPitch only for array
                    VerifyResourceQPitch<true>(MCSResourceInfo, ExpectedQPitch);
                }

                uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, MCSTileSize[0][1]);
                VerifyResourceSize<true>(MCSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, GMM_KBYTE(4))); //MCS Tile is TileY

                pGmmULTClientContext->DestroyResInfoObject(MCSResourceInfo);
            } //MCS

            pGmmULTClientContext->DestroyResInfoObject(MSSResourceInfo);
        } //NumSamples = k
    }     //Iterate through all Input types

    //Mip-mapped, MSAA case:
}